

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUITabControl::CGUITabControl
          (CGUITabControl *this,IGUIEnvironment *environment,IGUIElement *parent,
          rect<int> *rectangle,bool fillbackground,bool border,s32 id)

{
  _func_int *p_Var1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  IGUIButton *pIVar5;
  undefined8 uVar6;
  rect<int> local_38;
  
  *(undefined ***)&this->field_0x188 = &PTR__IReferenceCounted_0025f7e0;
  uVar4 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined4 *)&this->field_0x198 = 1;
  local_38.UpperLeftCorner = rectangle->UpperLeftCorner;
  local_38.LowerRightCorner = rectangle->LowerRightCorner;
  IGUIElement::IGUIElement
            ((IGUIElement *)this,&PTR_construction_vtable_24__00270ca8,EGUIET_TAB_CONTROL,
             environment,parent,id,&local_38);
  *(undefined8 *)this = 0x270aa8;
  *(undefined8 *)&this->field_0x188 = 0x270c88;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Tabs).is_sorted = true;
  this->ActiveTabIndex = -1;
  this->Border = border;
  this->FillBackground = fillbackground;
  this->ScrollControl = false;
  this->TabHeight = 0;
  this->VerticalAlignment = EGUIA_UPPERLEFT;
  this->UpButton = (IGUIButton *)0x0;
  this->DownButton = (IGUIButton *)0x0;
  this->TabMaxWidth = 0;
  this->CurrentScrollTabIndex = 0;
  this->TabExtraWidth = 0x14;
  plVar3 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  this->TabHeight = 0x20;
  if (plVar3 != (long *)0x0) {
    uVar4 = (**(code **)(*plVar3 + 0x40))(plVar3);
    iVar2 = (**(code **)(*plVar3 + 0x10))(plVar3,7);
    this->TabHeight = iVar2 + 2;
  }
  local_38.UpperLeftCorner.X = 0;
  local_38.UpperLeftCorner.Y = 0;
  local_38.LowerRightCorner.X = 10;
  local_38.LowerRightCorner.Y = 10;
  pIVar5 = (IGUIButton *)
           (**(code **)(**(long **)&this->field_0x128 + 0xb8))
                     (*(long **)&this->field_0x128,&local_38,this,0xffffffff,0,0);
  this->UpButton = pIVar5;
  if (pIVar5 != (IGUIButton *)0x0) {
    (*(pIVar5->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])(pIVar5,uVar4);
    (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
              (this->UpButton,0);
    (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])
              (this->UpButton,1);
    pIVar5 = this->UpButton;
    (pIVar5->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
    (pIVar5->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
    (pIVar5->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
    (pIVar5->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
    uVar6 = (**(code **)(**(long **)&this->field_0x128 + 0x98))();
    (*(pIVar5->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])(pIVar5,uVar6);
    p_Var1 = (_func_int *)
             ((long)&(this->UpButton->super_IGUIElement).Children.
                     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev +
             (long)(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3]
             );
    *(int *)p_Var1 = *(int *)p_Var1 + 1;
  }
  local_38.UpperLeftCorner.X = 0;
  local_38.UpperLeftCorner.Y = 0;
  local_38.LowerRightCorner.X = 10;
  local_38.LowerRightCorner.Y = 10;
  pIVar5 = (IGUIButton *)
           (**(code **)(**(long **)&this->field_0x128 + 0xb8))
                     (*(long **)&this->field_0x128,&local_38,this,0xffffffff,0,0);
  this->DownButton = pIVar5;
  if (pIVar5 != (IGUIButton *)0x0) {
    (*(pIVar5->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x31])(pIVar5,uVar4);
    (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
              (this->DownButton,0);
    (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x11])
              (this->DownButton,1);
    pIVar5 = this->DownButton;
    (pIVar5->super_IGUIElement).AlignLeft = EGUIA_LOWERRIGHT;
    (pIVar5->super_IGUIElement).AlignRight = EGUIA_LOWERRIGHT;
    (pIVar5->super_IGUIElement).AlignTop = EGUIA_UPPERLEFT;
    (pIVar5->super_IGUIElement).AlignBottom = EGUIA_UPPERLEFT;
    uVar4 = (**(code **)(**(long **)&this->field_0x128 + 0x98))();
    (*(pIVar5->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])(pIVar5,uVar4);
    p_Var1 = (_func_int *)
             ((long)&(this->DownButton->super_IGUIElement).Children.
                     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev +
             (long)(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
                   [-3]);
    *(int *)p_Var1 = *(int *)p_Var1 + 1;
  }
  (**(code **)(*(long *)this + 0x1a8))(this,0);
  refreshSprites(this);
  return;
}

Assistant:

CGUITabControl::CGUITabControl(IGUIEnvironment *environment,
		IGUIElement *parent, const core::rect<s32> &rectangle,
		bool fillbackground, bool border, s32 id) :
		IGUITabControl(environment, parent, id, rectangle),
		ActiveTabIndex(-1),
		Border(border), FillBackground(fillbackground), ScrollControl(false), TabHeight(0), VerticalAlignment(EGUIA_UPPERLEFT),
		UpButton(0), DownButton(0), TabMaxWidth(0), CurrentScrollTabIndex(0), TabExtraWidth(20)
{
#ifdef _DEBUG
	setDebugName("CGUITabControl");
#endif

	IGUISkin *skin = Environment->getSkin();
	IGUISpriteBank *sprites = 0;

	TabHeight = 32;

	if (skin) {
		sprites = skin->getSpriteBank();
		TabHeight = skin->getSize(gui::EGDS_BUTTON_HEIGHT) + 2;
	}

	UpButton = Environment->addButton(core::rect<s32>(0, 0, 10, 10), this);

	if (UpButton) {
		UpButton->setSpriteBank(sprites);
		UpButton->setVisible(false);
		UpButton->setSubElement(true);
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		UpButton->setOverrideFont(Environment->getBuiltInFont());
		UpButton->grab();
	}

	DownButton = Environment->addButton(core::rect<s32>(0, 0, 10, 10), this);

	if (DownButton) {
		DownButton->setSpriteBank(sprites);
		DownButton->setVisible(false);
		DownButton->setSubElement(true);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		DownButton->setOverrideFont(Environment->getBuiltInFont());
		DownButton->grab();
	}

	setTabVerticalAlignment(EGUIA_UPPERLEFT);
	refreshSprites();
}